

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UniquenessConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UniquenessConstraintSyntax,slang::parsing::Token&,slang::syntax::RangeListSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,RangeListSyntax *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  UniquenessConstraintSyntax *pUVar11;
  
  pUVar11 = (UniquenessConstraintSyntax *)allocate(this,0x40,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_2->kind;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pUVar11->super_ConstraintItemSyntax).super_SyntaxNode.kind = UniquenessConstraint;
  (pUVar11->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar11->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pUVar11->unique).kind = TVar3;
  (pUVar11->unique).field_0x2 = uVar4;
  (pUVar11->unique).numFlags = (NumericTokenFlags)NVar5.raw;
  (pUVar11->unique).rawLen = uVar6;
  (pUVar11->unique).info = pIVar1;
  (pUVar11->ranges).ptr = args_1;
  (pUVar11->semi).kind = TVar7;
  (pUVar11->semi).field_0x2 = uVar8;
  (pUVar11->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pUVar11->semi).rawLen = uVar10;
  (pUVar11->semi).info = pIVar2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pUVar11;
  return pUVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }